

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O0

void __thiscall Generator::_run(Generator *this,search *sch,input *in,output *out)

{
  bool bVar1;
  char cVar2;
  action a;
  ezexample *peVar3;
  reference pcVar4;
  predictor *ppVar5;
  void *pvVar6;
  string *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  search *in_RDI;
  char c;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> all;
  char c_3;
  iterator __end2_2;
  iterator __begin2_2;
  string *__range2_2;
  nextstr xx;
  iterator __end3;
  iterator __begin3;
  vector<nextstr,_std::allocator<nextstr>_> *__range3;
  float best_count;
  char best_char;
  char c_2;
  iterator __end2_1;
  iterator __begin2_1;
  output *__range2_1;
  char c_1;
  iterator __end2;
  iterator __begin2;
  output *__range2;
  int i;
  string tmp;
  ezexample ex;
  int m;
  vector<nextstr,_std::allocator<nextstr>_> next;
  int N;
  v_array<unsigned_int> ref;
  Trie *cdict;
  IncrementalEditDistance ied;
  example *in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  Trie *in_stack_fffffffffffff908;
  IncrementalEditDistance *in_stack_fffffffffffff910;
  char c_00;
  example *in_stack_fffffffffffff930;
  float val;
  undefined4 in_stack_fffffffffffff938;
  int in_stack_fffffffffffff93c;
  ezexample *in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  ezexample *in_stack_fffffffffffff950;
  size_t in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  string *in_stack_fffffffffffff968;
  allocator *paVar7;
  IncrementalEditDistance *in_stack_fffffffffffff970;
  string *this_00;
  IncrementalEditDistance *in_stack_fffffffffffff978;
  ptag my_tag;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  int iVar8;
  predictor *in_stack_fffffffffffff9d8;
  vector<nextstr,_std::allocator<nextstr>_> *in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa48;
  Trie *in_stack_fffffffffffffa50;
  string local_540 [32];
  string local_520 [39];
  char local_4f9;
  undefined8 local_4f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f0;
  undefined8 local_4e8;
  vw_namespace local_4da;
  undefined1 local_4d9 [33];
  string local_4b8 [32];
  string local_498 [39];
  undefined1 local_471 [33];
  string local_450 [32];
  bool local_430;
  float local_42c;
  float local_408;
  nextstr *local_400;
  __normal_iterator<nextstr_*,_std::vector<nextstr,_std::allocator<nextstr>_>_> local_3f8;
  undefined1 *local_3f0;
  float local_3e8;
  bool local_3e2;
  vw_namespace local_3e1;
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [39];
  bool local_379;
  undefined8 local_378;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  string *local_368;
  vw_namespace local_35a;
  allocator local_359;
  string local_358 [32];
  string local_338 [39];
  char local_311;
  undefined8 local_310;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  string *local_300;
  vw_namespace local_2f1;
  string local_2f0 [32];
  string local_2d0 [32];
  int local_2b0;
  allocator local_2a9;
  undefined1 local_2a8 [39];
  vw_namespace local_281 [381];
  int local_104;
  undefined1 local_100 [24];
  int local_e8;
  IncrementalEditDistance *local_b8;
  IncrementalEditDistance local_b0;
  string *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  IncrementalEditDistance::IncrementalEditDistance
            (in_stack_fffffffffffff970,in_stack_fffffffffffff968,
             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),in_stack_fffffffffffff958
             ,(size_t)in_stack_fffffffffffff950);
  local_b8 = (IncrementalEditDistance *)in_RDI[1].task_name;
  v_init<unsigned_int>();
  local_e8 = std::__cxx11::string::length();
  std::__cxx11::string::operator=(local_20,"^");
  std::vector<nextstr,_std::allocator<nextstr>_>::vector
            ((vector<nextstr,_std::allocator<nextstr>_> *)0x11cf16);
  for (local_104 = 1;
      local_104 == local_e8 * 2 || SBORROW4(local_104,local_e8 * 2) != local_104 + local_e8 * -2 < 0
      ; local_104 = local_104 + 1) {
    ezexample::ezexample
              (in_stack_fffffffffffff950,
               (vw *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               SUB81((ulong)in_stack_fffffffffffff940 >> 0x38,0),
               (vw *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    vw_namespace::vw_namespace(local_281,'l');
    peVar3 = ezexample::operator()
                       ((ezexample *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                        (vw_namespace *)in_stack_fffffffffffff8f8);
    ezexample::operator()
              (in_stack_fffffffffffff950,
               (char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               (float)((ulong)in_stack_fffffffffffff940 >> 0x20));
    ezexample::operator()
              (in_stack_fffffffffffff950,
               (char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
               (float)((ulong)in_stack_fffffffffffff940 >> 0x20));
    if (local_e8 != local_104) {
      ezexample::operator()
                (in_stack_fffffffffffff950,
                 (char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                 (float)((ulong)in_stack_fffffffffffff940 >> 0x20));
    }
    vw_namespace::vw_namespace((vw_namespace *)(local_2a8 + 0x26),'s');
    ezexample::operator()
              ((ezexample *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               (vw_namespace *)in_stack_fffffffffffff8f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_2a8,"$",&local_2a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    for (local_2b0 = local_104; local_104 + -0xf <= local_2b0 && -1 < local_2b0;
        local_2b0 = local_2b0 + -1) {
      std::__cxx11::string::operator[]((ulong)local_20);
      std::operator+((char)((uint)in_stack_fffffffffffff93c >> 0x18),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff930);
      in_stack_fffffffffffff978 = (IncrementalEditDistance *)local_2a8;
      this_00 = local_2d0;
      std::__cxx11::string::operator=((string *)in_stack_fffffffffffff978,this_00);
      std::__cxx11::string::~string(this_00);
      std::operator+((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff940);
      ezexample::operator()
                (in_stack_fffffffffffff940,
                 (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      std::__cxx11::string::~string(local_2f0);
    }
    vw_namespace::vw_namespace(&local_2f1,'c');
    ezexample::operator()
              ((ezexample *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               (vw_namespace *)in_stack_fffffffffffff8f8);
    local_300 = local_20;
    local_308._M_current = (char *)std::__cxx11::string::begin();
    local_310 = std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffff8f8), bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_308);
      local_311 = *pcVar4;
      paVar7 = &local_359;
      cVar2 = local_311;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,1,cVar2,paVar7);
      std::operator+((char *)in_stack_fffffffffffff908,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
      ezexample::operator()
                (in_stack_fffffffffffff940,
                 (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_308);
    }
    ezexample::operator()
              (in_stack_fffffffffffff950,
               (char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
    vw_namespace::vw_namespace(&local_35a,'w');
    ezexample::operator()
              ((ezexample *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               (vw_namespace *)in_stack_fffffffffffff8f8);
    std::__cxx11::string::operator=((string *)local_2a8,"");
    local_368 = local_20;
    local_370._M_current = (char *)std::__cxx11::string::begin();
    local_378 = std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                              (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_fffffffffffff8f8), bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_370);
      local_379 = (bool)*pcVar4;
      if (local_379 != true) {
        if (local_379 == true) {
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff940);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff908,
                         (char *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
          ezexample::operator()
                    (in_stack_fffffffffffff940,
                     (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
          std::__cxx11::string::~string(local_3a0);
          std::__cxx11::string::~string(local_3c0);
          std::__cxx11::string::operator=((string *)local_2a8,"");
        }
        else {
          std::__cxx11::string::operator+=((string *)local_2a8,local_379);
        }
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_370);
    }
    std::operator+((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff940);
    ezexample::operator()
              (in_stack_fffffffffffff940,
               (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    std::__cxx11::string::~string(local_3e0);
    if (local_b8 != (IncrementalEditDistance *)0x0) {
      std::vector<nextstr,_std::allocator<nextstr>_>::clear
                ((vector<nextstr,_std::allocator<nextstr>_> *)0x11d62f);
      Trie::get_next(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      vw_namespace::vw_namespace(&local_3e1,'d');
      ezexample::operator()
                ((ezexample *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                 (vw_namespace *)in_stack_fffffffffffff8f8);
      local_3e2 = true;
      local_3e8 = 0.0;
      local_3f0 = local_100;
      local_3f8._M_current =
           (nextstr *)
           std::vector<nextstr,_std::allocator<nextstr>_>::begin
                     ((vector<nextstr,_std::allocator<nextstr>_> *)in_stack_fffffffffffff8f8);
      local_400 = (nextstr *)
                  std::vector<nextstr,_std::allocator<nextstr>_>::end
                            ((vector<nextstr,_std::allocator<nextstr>_> *)in_stack_fffffffffffff8f8)
      ;
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<nextstr_*,_std::vector<nextstr,_std::allocator<nextstr>_>_>
                            *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                           (__normal_iterator<nextstr_*,_std::vector<nextstr,_std::allocator<nextstr>_>_>
                            *)in_stack_fffffffffffff8f8);
        val = (float)((ulong)in_stack_fffffffffffff930 >> 0x20);
        if (!bVar1) break;
        __gnu_cxx::__normal_iterator<nextstr_*,_std::vector<nextstr,_std::allocator<nextstr>_>_>::
        operator*(&local_3f8);
        nextstr::nextstr((nextstr *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                         (nextstr *)in_stack_fffffffffffff8f8);
        if (0.0 < local_42c) {
          in_stack_fffffffffffff94c = (int)local_430;
          in_stack_fffffffffffff950 = (ezexample *)local_471;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_471 + 1),1,(char)in_stack_fffffffffffff94c,
                     (allocator *)in_stack_fffffffffffff950);
          std::operator+((char *)in_stack_fffffffffffff908,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
          ezexample::operator()
                    (in_stack_fffffffffffff940,
                     (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                     (float)((ulong)in_stack_fffffffffffff930 >> 0x20));
          std::__cxx11::string::~string(local_450);
          std::__cxx11::string::~string((string *)(local_471 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_471);
        }
        if (0.0 < local_408) {
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff940);
          ezexample::operator()
                    (in_stack_fffffffffffff940,
                     (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                     (float)((ulong)in_stack_fffffffffffff930 >> 0x20));
          std::__cxx11::string::~string(local_498);
        }
        if (local_3e8 < local_408) {
          local_3e8 = local_408;
          local_3e2 = local_430;
        }
        nextstr::~nextstr((nextstr *)0x11d92e);
        __gnu_cxx::__normal_iterator<nextstr_*,_std::vector<nextstr,_std::allocator<nextstr>_>_>::
        operator++(&local_3f8);
      }
      if (0.0 < local_3e8) {
        in_stack_fffffffffffff93c = (int)local_3e2;
        in_stack_fffffffffffff940 = (ezexample *)local_4d9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_4d9 + 1),1,(char)in_stack_fffffffffffff93c,
                   (allocator *)in_stack_fffffffffffff940);
        std::operator+((char *)in_stack_fffffffffffff908,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
        ezexample::operator()
                  (in_stack_fffffffffffff940,
                   (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),val);
        std::__cxx11::string::~string(local_4b8);
        std::__cxx11::string::~string((string *)(local_4d9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_4d9);
      }
    }
    vw_namespace::vw_namespace(&local_4da,'i');
    ezexample::operator()
              ((ezexample *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               (vw_namespace *)in_stack_fffffffffffff8f8);
    std::__cxx11::string::operator=((string *)local_2a8,"");
    local_4e8 = local_18;
    local_4f0._M_current = (char *)std::__cxx11::string::begin();
    local_4f8 = std::__cxx11::string::end();
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffff8f8);
      my_tag = (ptag)((ulong)peVar3 >> 0x20);
      if (!bVar1) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_4f0);
      local_4f9 = *pcVar4;
      if (local_4f9 == ' ') {
        std::operator+((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff940);
        ezexample::operator()
                  (in_stack_fffffffffffff940,
                   (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
        std::__cxx11::string::~string(local_520);
        std::__cxx11::string::operator=((string *)local_2a8,"");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_2a8,local_4f9);
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_4f0);
    }
    std::operator+((char *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff940);
    ezexample::operator()
              (in_stack_fffffffffffff940,
               (string *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938));
    std::__cxx11::string::~string(local_540);
    v_array<unsigned_int>::clear
              ((v_array<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    IncrementalEditDistance::all_next(in_stack_fffffffffffff978);
    Search::predictor::predictor
              ((predictor *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),in_RDI,
               my_tag);
    in_stack_fffffffffffff930 =
         ezexample::get((ezexample *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    ppVar5 = Search::predictor::set_input
                       ((predictor *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                        in_stack_fffffffffffff8f8);
    c_00 = (char)((ulong)ppVar5 >> 0x38);
    Search::predictor::set_allowed
              ((predictor *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                *)in_stack_fffffffffffff8f8);
    a = Search::predictor::predict(in_stack_fffffffffffff9d8);
    cVar2 = action2char(a);
    Search::predictor::~predictor
              ((predictor *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
    if (cVar2 == '$') {
      iVar8 = 2;
    }
    else {
      std::__cxx11::string::operator+=(local_20,cVar2);
      IncrementalEditDistance::append((IncrementalEditDistance *)in_stack_fffffffffffff930,c_00);
      if (local_b8 != (IncrementalEditDistance *)0x0) {
        in_stack_fffffffffffff910 =
             (IncrementalEditDistance *)
             Trie::step(in_stack_fffffffffffff908,(char)((uint)in_stack_fffffffffffff904 >> 0x18));
        local_b8 = in_stack_fffffffffffff910;
      }
      iVar8 = 0;
    }
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    ~vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             *)in_stack_fffffffffffff910);
    std::__cxx11::string::~string((string *)local_2a8);
    ezexample::~ezexample(in_stack_fffffffffffff940);
    if (iVar8 != 0) break;
    in_stack_fffffffffffff9b4 = 0;
  }
  pvVar6 = (void *)IncrementalEditDistance::finish_distance(&local_b0);
  in_RDI[1].metatask_data = pvVar6;
  Search::search::loss
            ((search *)CONCAT44((float)in_RDI[1].metatask_data,(float)(long)in_RDI[1].metatask_data)
             ,local_10._4_4_);
  std::vector<nextstr,_std::allocator<nextstr>_>::~vector
            ((vector<nextstr,_std::allocator<nextstr>_> *)in_stack_fffffffffffff910);
  IncrementalEditDistance::~IncrementalEditDistance(in_stack_fffffffffffff910);
  return;
}

Assistant:

void _run(Search::search& sch, input& in, output& out)
  { IncrementalEditDistance ied(in.out);

    Trie* cdict = dict;

    v_array<action> ref = v_init<action>();
    int N = in.in.length();
    out = "^";
    vector<nextstr> next;
    for (int m=1; m<=N*2; m++)     // at most |in|*2 outputs
    { ezexample ex(&vw_obj);

      // length info
      ex(vw_namespace('l'))
      ("in", (float)N)
      ("out", (float)m);
      if (N != m)
        ex("diff", (float)(N-m));

      // suffixes thus far
      ex(vw_namespace('s'));
      string tmp("$");
      for (int i=m; i >= m-15 && i >= 0; i--)
      { tmp = out[i] + tmp;
        ex("p=" + tmp);
      }

      // characters thus far
      ex(vw_namespace('c'));
      for (char c : out) ex("c=" + string(1,c));
      ex("c=$");

      // words thus far
      ex(vw_namespace('w'));
      tmp = "";
      for (char c : out)
      { if (c == '^') continue;
        if (c == ' ')
        { ex("w=" + tmp + "$");
          tmp = "";
        }
        else tmp += c;
      }
      ex("w=" + tmp);

      // do we match the trie?
      if (cdict)
      { next.clear();
        cdict->get_next(nullptr, next);
        ex(vw_namespace('d'));
        char best_char = '~'; float best_count = 0.;
        for (auto xx : next)
        { if (xx.cw > 0.) ex("c=" + string(1,xx.c), xx.cw);
          if (xx.sw > 0.) ex("mc=" + xx.s, xx.sw);
          if (xx.sw > best_count) { best_count = xx.sw; best_char = xx.c; }
        }
        if (best_count > 0.)
          ex("best=" + string(1,best_char), best_count);
      }

      // input
      /*
      ex(vw_namespace('i'));
      ex("c=^");
      for (int n=0; n<N; n++)
        ex("c=" + in.in[n]);
      ex("c=$");
      */
      ex(vw_namespace('i'));
      tmp = "";
      for (char c : in.in)
      { if (c == ' ')
        { ex("w=" + tmp);
          tmp = "";
        }
        else tmp += c;
      }
      ex("w=" + tmp);

      ref.clear();

      /*
      vector<char>& best = ied.next();
      if (best.size() == 0) ref.push_back( char2action('$') );
      else for (char c : best) ref.push_back( char2action(c) );
      char c = action2char( Search::predictor(sch, m)
                            .set_input(* ex.get())
                            .set_oracle(ref)
                            .predict() );
      */

      vector< pair<action,float> > all = ied.all_next();
      char c = action2char( Search::predictor(sch, m)
                            .set_input(* ex.get())
                            .set_allowed(all)
                            .predict() );

      if (c == '$') break;
      out += c;
      ied.append(c);
      if (cdict) cdict = cdict->step(c);
    }

    dist = ied.finish_distance();
    sch.loss((float)dist * in.weight);
  }